

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O1

void buzz(int type,int nd,xchar sx,xchar sy,int dx,int dy)

{
  byte *pbVar1;
  uint uVar2;
  permonst *ppVar3;
  obj *poVar4;
  xchar x;
  boolean bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  obj *poVar9;
  char *pcVar10;
  char *pcVar11;
  undefined7 in_register_00000009;
  ulong uVar12;
  char *pcVar13;
  undefined7 in_register_00000011;
  char *pcVar14;
  byte bVar15;
  int tmp;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  undefined4 uVar19;
  undefined4 in_register_0000008c;
  ulong uVar20;
  undefined7 uVar22;
  uint beam_type;
  monst *worm;
  byte bVar23;
  uint uVar24;
  obj *poVar25;
  ulong uVar26;
  byte bVar27;
  uint uVar28;
  int iVar29;
  bool bVar30;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  boolean shopdamage;
  boolean local_c1;
  ulong local_c0;
  ulong local_b8;
  char *local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  obj *local_78;
  coord local_6a;
  ulong local_68;
  schar *local_60;
  ulong local_58;
  int local_50;
  uint local_4c;
  uint local_48;
  int local_44;
  uint local_40;
  int local_3c;
  permonst *local_38;
  undefined8 uVar21;
  
  local_a0 = CONCAT44(in_register_0000008c,dy);
  uVar31 = (ulong)(uint)dx;
  local_90 = (ulong)(uint)type;
  local_68 = (ulong)(uint)-type;
  if (0 < type) {
    local_68 = (ulong)(uint)type;
  }
  iVar7 = (int)(local_68 / 10);
  iVar8 = (int)local_68;
  beam_type = iVar8 + iVar7 * -10;
  local_c1 = '\0';
  bVar32 = type - 0x1eU < 0xfffffff6;
  local_48 = type + 0x13;
  bVar33 = local_48 < 0xfffffff6;
  local_44 = iVar8 + 0x17e + iVar7 * -10;
  if (9 < type - 10U) {
    local_44 = 0;
  }
  uVar17 = local_68;
  if (type < -0x1d) {
    uVar17 = (ulong)beam_type;
  }
  local_b0 = flash_types[uVar17];
  if ((u._1052_1_ & 1) != 0) {
    if (-1 < type) {
      iVar7 = zap_hit_mon(u.ustuck,type,nd,&local_78);
      if (u.ustuck == (monst *)0x0) {
        u._1052_1_ = u._1052_1_ & 0xfe;
      }
      else {
        pcVar11 = The(local_b0);
        pcVar10 = mon_nam(u.ustuck);
        pcVar14 = "!";
        if (iVar7 < 5) {
          pcVar14 = ".";
        }
        pcVar13 = "?";
        if (-1 < iVar7) {
          pcVar13 = pcVar14;
        }
        pline("%s rips into %s%s",pcVar11,pcVar10,pcVar13);
      }
      if (iVar7 == 1000) {
        (u.ustuck)->mhp = 0;
      }
      if ((u.ustuck)->mhp < 1) {
        killed(u.ustuck);
        return;
      }
    }
    return;
  }
  uVar16 = (uint)CONCAT71(in_register_00000009,sy);
  bVar30 = iVar8 != 0x18 && (!bVar32 || !bVar33);
  if (type < 0) {
    newsym((int)u.ux,(int)u.uy);
  }
  uVar6 = mt_random();
  uVar17 = local_a0;
  local_6a = bhitpos;
  iVar8 = (int)local_a0;
  local_40 = (uint)bVar30;
  iVar7 = zapdir_to_effect(dx,iVar8,beam_type,bVar30);
  tmp_at(-1,iVar7);
  uVar12 = (ulong)(uVar6 + 6 + (uVar6 / 7) * -7);
  if (iVar8 == 0 && dx == 0) {
    uVar12 = 0;
  }
  bVar30 = (int)local_68 == 0x18;
  local_50 = 0xb;
  if ((int)local_90 != -0x18) {
    local_50 = 0;
  }
  local_4c = -(uint)((int)local_90 != -0x18) | 0xfffffffd;
  local_38 = mons + 0x144;
  uVar6 = (uint)CONCAT71(in_register_00000011,sx);
  do {
    local_a8 = (ulong)uVar16;
    uVar26 = (ulong)uVar6;
    uVar24 = (int)uVar31 + uVar6;
    uVar16 = (int)uVar17 + uVar16;
    bVar23 = (byte)uVar24;
    uVar28 = (uint)(char)bVar23;
    local_80 = (ulong)uVar28;
    local_3c = uVar28 - 1;
    bVar15 = (byte)uVar16;
    iVar7 = (int)(char)bVar15;
    if ((0x4e < (byte)local_3c) || (0x14 < bVar15)) goto LAB_00296e10;
    local_58 = (ulong)(uVar24 & 0xff);
    uVar20 = (ulong)(uVar16 & 0xff);
    if (level->locations[local_58][uVar20].typ == '\0') goto LAB_00296e10;
    worm = level->monsters[local_58][uVar20];
    if (worm == (monst *)0x0) {
      worm = (monst *)0x0;
    }
    else if ((worm->field_0x61 & 2) != 0) {
      worm = (monst *)0x0;
    }
    local_60 = &level->locations[local_58][uVar20].typ;
    local_a0 = uVar17;
    local_98 = uVar31;
    local_88 = uVar20;
    if ((viz_array[uVar20][local_58] & 2U) != 0) {
      local_c0 = uVar12;
      if (worm == (monst *)0x0) {
        if ((level->locations[local_58][uVar20].field_0x6 & 8) != 0) {
          unmap_object(uVar28,iVar7);
          newsym(uVar28,iVar7);
        }
      }
      else {
        if (worm->wormno == '\0') {
          if (((viz_array[worm->my][worm->mx] & 2U) != 0) ||
             (((((u.uprops[0x1e].intrinsic == 0 &&
                 (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                  (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
               ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
              (((viz_array[worm->my][worm->mx] & 1U) != 0 && ((worm->data->mflags3 & 0x200) != 0))))
             )) goto LAB_00295cb6;
        }
        else {
          bVar5 = worm_known(level,worm);
          if (bVar5 != '\0') {
LAB_00295cb6:
            uVar2 = *(uint *)&worm->field_0x60;
            if ((((uVar2 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar2 & 0x280) == 0) goto LAB_00295d05;
            }
            else if (((uVar2 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00295d05:
              if ((u._1052_1_ & 0x20) == 0) goto LAB_00295ea7;
            }
          }
        }
        if (((((worm->data->mflags1 & 0x10000) != 0) ||
             ((poVar9 = which_armor(worm,4), poVar9 != (obj *)0x0 &&
              (poVar9 = which_armor(worm,4), poVar9->otyp == 0x4f)))) ||
            ((((u.uprops[0x1e].intrinsic == 0 &&
               (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
              (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
               ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                 (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                 youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
             (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
              (iVar8 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), 0x40 < iVar8)))))) &&
           (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
            (bVar5 = match_warn_of_mon(worm), bVar5 == '\0')))) {
          map_invisible(bVar23,bVar15);
        }
      }
LAB_00295ea7:
      if (('\x10' < *local_60) ||
         ((((byte)((char)uVar6 - 1U) < 0x4f && ((byte)local_a8 < 0x15)) &&
          ((viz_array[local_a8 & 0xff][uVar26 & 0xff] & 2U) != 0)))) {
        tmp_at(uVar28,iVar7);
      }
      (*windowprocs.win_delay)();
      uVar12 = local_c0;
    }
    bhitpos.y = bVar15;
    bhitpos.x = bVar23;
    if ((int)local_90 != 0xb) {
      iVar8 = zap_over_floor(bVar23,bVar15,(int)local_90,&local_c1);
      uVar12 = (ulong)(uint)(iVar8 + (int)uVar12);
    }
    uVar20 = local_88;
    if (worm == (monst *)0x0) {
      uVar17 = local_a0;
      uVar31 = local_98;
      if (((bVar23 != u.ux) || (bVar15 != u.uy)) || ((int)uVar12 < 0)) goto LAB_00296d9a;
      local_c0 = uVar12;
      nomul(0,(char *)0x0);
      if (((u.usteed != (monst *)0x0) && (uVar6 = mt_random(), uVar6 * -0x55555555 < 0x55555556)) &&
         ((worm = u.usteed, !bVar30 && (!bVar32 || !bVar33) ||
          (bVar5 = mon_reflects(u.usteed,(char *)0x0), worm = u.usteed, bVar5 == '\0'))))
      goto LAB_00295f60;
      iVar8 = zap_hit_check((int)u.uac,0);
      if (iVar8 == 0) {
        The(local_b0);
        pline("%s whizzes by you!");
        goto LAB_00296d5d;
      }
      local_c0 = (ulong)((int)local_c0 - 2);
      The(local_b0);
      pline("%s hits you!");
      if ((bVar30 || bVar32 && bVar33) &&
         ((youmonst.data == mons + 0x94 || youmonst.data == mons + 0x9d) ||
          u.uprops[0x2a].extrinsic != 0)) {
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          ureflects("But %s reflects from your %s!","it");
        }
        else {
          pline("For some reason you are not affected.");
        }
        local_98 = (ulong)(uint)-(int)local_98;
        local_a0 = (ulong)(uint)-(int)local_a0;
        shieldeff((xchar)local_80,bVar15);
        goto LAB_00296d5d;
      }
      iVar8 = 0;
      switch(beam_type) {
      case 0:
        iVar8 = nd;
        iVar29 = nd;
        local_b8 = uVar26;
        if (nd != 0) {
          do {
            uVar6 = mt_random();
            iVar8 = iVar8 + uVar6 % 6;
            iVar29 = iVar29 + -1;
          } while (iVar29 != 0);
        }
        mana_damageu(iVar8,(monst *)0x0,local_b0,0,'\x01');
        break;
      case 1:
        iVar8 = nd;
        iVar29 = nd;
        local_b8 = uVar26;
        if (nd != 0) {
          do {
            uVar6 = mt_random();
            iVar29 = iVar29 + uVar6 % 6;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        fire_damageu(iVar29,(monst *)0x0,local_b0,0,7,'\x01','\0');
        break;
      case 2:
        iVar8 = nd;
        iVar29 = nd;
        local_b8 = uVar26;
        if (nd != 0) {
          do {
            uVar6 = mt_random();
            iVar29 = iVar29 + uVar6 % 6;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        cold_damageu(iVar29,(monst *)0x0,local_b0,0,7);
        break;
      case 3:
        if ((((u.uprops[3].intrinsic != 0 || u.uprops[3].extrinsic != 0) ||
             (((byte)youmonst.mintrinsics & 4) != 0)) || (u.uprops[0x38].extrinsic != 0)) &&
           ((((u.uprops[3].intrinsic >> 0x1a & 1) == 0 ||
             ((u.uprops[3].intrinsic & 0xfbffffff) != 0 || u.uprops[3].extrinsic != 0)) ||
            ((((byte)youmonst.mintrinsics & 4) != 0 || (u.uprops[0x38].extrinsic != 0)))))) {
          shieldeff(u.ux,u.uy);
          pcVar11 = "You don\'t feel sleepy.";
          goto LAB_00296d01;
        }
        if ((((u.uprops[3].intrinsic >> 0x1a & 1) != 0) &&
            ((u.uprops[3].intrinsic & 0xfbffffff) == 0 && u.uprops[3].extrinsic == 0)) &&
           ((((byte)youmonst.mintrinsics & 4) == 0 && (u.uprops[0x38].extrinsic == 0)))) {
          shieldeff(u.ux,u.uy);
        }
        uVar31 = 0x19;
        if (((((u.uprops[3].intrinsic >> 0x1a & 1) != 0) &&
             ((u.uprops[3].intrinsic & 0xfbffffff) == 0 && u.uprops[3].extrinsic == 0)) &&
            (((byte)youmonst.mintrinsics & 4) == 0)) &&
           (uVar31 = 0x19, u.uprops[0x38].extrinsic == 0)) {
          uVar31 = 0xc;
        }
        iVar8 = nd;
        iVar29 = nd;
        local_b8 = uVar26;
        if (nd != 0) {
          do {
            uVar6 = mt_random();
            iVar8 = iVar8 + (int)((ulong)uVar6 % uVar31);
            iVar29 = iVar29 + -1;
          } while (iVar29 != 0);
        }
        fall_asleep(-iVar8,'\x01');
        break;
      case 4:
        if ((int)local_68 == 0x18) {
          if ((((u.uprops[4].intrinsic == 0 && u.uprops[4].extrinsic == 0) &&
               (((byte)youmonst.mintrinsics & 8) == 0)) ||
              (((u.uprops[4].intrinsic >> 0x1a & 1) != 0 &&
               (((u.uprops[4].intrinsic & 0xfbffffff) == 0 && u.uprops[4].extrinsic == 0 &&
                (((byte)youmonst.mintrinsics & 8) == 0)))))) &&
             (((u.uprops[4].intrinsic >> 0x1a & 1) == 0 ||
              ((((u.uprops[4].intrinsic & 0xfbffffff) != 0 || u.uprops[4].extrinsic != 0 ||
                (((byte)youmonst.mintrinsics & 8) != 0)) ||
               (uVar6 = mt_random(),
               (uVar6 * -0x33333333 >> 1 | (uint)((uVar6 * -0x33333333 & 1) != 0) << 0x1f) <
               0x1999999a)))))) {
            poVar9 = uarms;
            if (uarms == (obj *)0x0) {
              if (uarm == (obj *)0x0) {
                if (uarmc != (obj *)0x0) {
                  destroy_arm(uarmc,'\x01');
                }
                if (uarmu != (obj *)0x0) {
                  destroy_arm(uarmu,'\x01');
                }
                goto LAB_0029738b;
              }
              poVar9 = uarm;
              if (uarmc != (obj *)0x0) {
                destroy_arm(uarmc,'\0');
                poVar9 = uarm;
              }
            }
            iVar8 = 0;
            destroy_arm(poVar9,'\0');
            goto switchD_0029637b_default;
          }
          pcVar11 = "You are not disintegrated.";
        }
        else {
          x = (xchar)local_80;
          if ((((youmonst.data)->mlet == '7') || (((youmonst.data)->mflags2 & 2) != 0)) ||
             ((youmonst.data == mons + 0x33 || (youmonst.data)->mlet == '\x16') ||
              ((youmonst.data)->mflags2 >> 9 & 1) != 0)) {
            shieldeff(x,bVar15);
            pcVar11 = "You seem unaffected.";
          }
          else {
            if ((u.uprops[0x2c].extrinsic == 0) &&
               ((u.umonnum == u.umonster || (bVar5 = resists_magm(&youmonst), bVar5 == '\0')))) {
LAB_0029738b:
              killer_format = 0;
              killer = local_b0;
              u.ugrave_arise = local_4c;
              done(local_50);
              uVar20 = local_88;
              goto LAB_00296d5d;
            }
            shieldeff(x,bVar15);
            pcVar11 = "You aren\'t affected.";
          }
        }
LAB_00296d01:
        iVar8 = 0;
        pline(pcVar11);
        goto switchD_0029637b_default;
      case 5:
        iVar8 = nd;
        iVar29 = nd;
        local_b8 = uVar26;
        if (nd != 0) {
          do {
            uVar6 = mt_random();
            iVar29 = iVar29 + uVar6 % 6;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        elec_damageu(iVar29,(monst *)0x0,local_b0,0,7,'\x01');
        break;
      case 6:
        poisoned("blast",3,"poisoned blast",0xf);
        iVar8 = 0;
        goto switchD_0029637b_default;
      case 7:
        iVar8 = 0;
        local_b8 = uVar26;
        if ((u.uprops[7].extrinsic == 0) && (((byte)youmonst.mintrinsics & 0x40) == 0)) {
          pline("The acid burns!");
          iVar29 = nd;
          iVar8 = nd;
          if (nd != 0) {
            do {
              uVar6 = mt_random();
              iVar8 = iVar8 + uVar6 % 6;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          exercise(0,'\0');
        }
        bVar34 = u.twoweap == '\0';
        uVar6 = mt_random();
        if (uVar6 % ((uint)bVar34 * 3 + 3) == 0) {
          erode_obj(uwep,'\x01','\x01');
        }
        if ((u.twoweap != '\0') && (uVar6 = mt_random(), uVar6 * -0x55555555 < 0x55555556)) {
          erode_obj(uswapwep,'\x01','\x01');
        }
        uVar6 = mt_random();
        uVar26 = local_b8;
        if ((uVar6 * -0x55555555 >> 1 | (uint)((uVar6 * -0x55555555 & 1) != 0) << 0x1f) < 0x2aaaaaab
           ) {
          erode_armor(&youmonst,'\x01');
        }
      default:
        goto switchD_0029637b_default;
      }
      iVar8 = 0;
      uVar26 = local_b8;
switchD_0029637b_default:
      if (((local_48 < 0xfffffff6) && ((int)local_90 < 0)) &&
         ((u.uprops[0x32].extrinsic != 0 || u.uprops[0x32].intrinsic != 0 && (iVar8 != 0)))) {
        iVar8 = (iVar8 - (iVar8 + 1 >> 0x1f)) + 1 >> 1;
      }
      losehp(iVar8,local_b0,0);
      uVar20 = local_88;
LAB_00296d5d:
      if ((beam_type == 5) && (bVar5 = resists_blnd(&youmonst), bVar5 == '\0')) {
        local_b8 = uVar26;
        pline("You are blinded by the flash!");
        iVar8 = nd;
        iVar29 = nd;
        if (nd != 0) {
          do {
            uVar6 = mt_random();
            iVar8 = iVar8 + uVar6 % 0x32;
            iVar29 = iVar29 + -1;
          } while (iVar29 != 0);
        }
        make_blinded((long)iVar8,'\0');
        uVar20 = local_88;
        uVar26 = local_b8;
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          pline("Your vision quickly clears.");
        }
      }
      stop_occupation();
      nomul(0,(char *)0x0);
      uVar17 = local_a0;
      uVar31 = local_98;
      uVar12 = local_c0;
    }
    else {
      if ((int)local_90 == 0xb) goto LAB_0029745c;
      local_c0 = uVar12;
      if (-1 < (int)local_90) {
        pbVar1 = (byte *)((long)&worm->mstrategy + 3);
        *pbVar1 = *pbVar1 & 0xcf;
      }
LAB_00295f60:
      iVar8 = find_mac(worm);
      iVar8 = zap_hit_check(iVar8,local_44);
      if (iVar8 == 0) {
        miss(local_b0,worm);
        uVar17 = local_a0;
        uVar31 = local_98;
        uVar12 = local_c0;
        uVar20 = local_88;
        goto LAB_00296d9a;
      }
      if ((bVar30 || bVar32 && bVar33) && (bVar5 = mon_reflects(worm,(char *)0x0), bVar5 != '\0')) {
        if ((viz_array[worm->my][worm->mx] & 2U) != 0) {
          hit(local_b0,'\0',worm,".");
          shieldeff(worm->mx,worm->my);
          mon_reflects(worm,"But it reflects from %s %s!");
        }
        uVar17 = (ulong)(uint)-(int)local_a0;
        uVar31 = (ulong)(uint)-(int)local_98;
LAB_002964df:
        iVar8 = (int)local_c0;
      }
      else {
        uVar6 = *(uint *)&worm->field_0x60;
        iVar8 = zap_hit_mon(worm,(int)local_90,nd,&local_78);
        ppVar3 = worm->data;
        if (((int)local_68 == 0x18) &&
           ((ppVar3 == mons + 0x144 || ppVar3 == mons + 0x146) || ppVar3 == mons + 0x145)) {
          if (worm->wormno == '\0') {
            if (((viz_array[worm->my][worm->mx] & 2U) != 0) ||
               (((((u.uprops[0x1e].intrinsic == 0 &&
                   (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                    (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                  ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                 ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                  (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
                (((viz_array[worm->my][worm->mx] & 1U) != 0 && ((ppVar3->mflags3 & 0x200) != 0))))))
            goto LAB_00297731;
          }
          else {
            bVar5 = worm_known(level,worm);
            if (bVar5 != '\0') {
LAB_00297731:
              uVar6 = *(uint *)&worm->field_0x60;
              if ((((uVar6 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((uVar6 & 0x280) == 0) goto LAB_00297789;
              }
              else if (((uVar6 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00297789:
                if ((u._1052_1_ & 0x20) == 0) {
                  hit(local_b0,'\0',worm,".");
                  pcVar11 = Monnam(worm);
                  pline("%s disintegrates.",pcVar11);
                  pcVar11 = Monnam(worm);
                  pcVar11 = s_suffix(pcVar11);
                  if ((((youmonst.data)->mflags1 & 0x1000) == 0) &&
                     (youmonst.data == mons + 0x1e || youmonst.data == mons + 0x17b)) {
                    pcVar10 = body_part(1);
                  }
                  else {
                    pcVar10 = body_part(1);
                    pcVar10 = makeplural(pcVar10);
                  }
                  pline("%s body reintegrates before your %s!",pcVar11,pcVar10);
                  Monnam(worm);
                  pline("%s resurrects!");
                }
              }
            }
          }
          worm->mhp = worm->mhpmax;
LAB_0029745c:
          tmp_at(-6,0);
          if ((int)local_90 == 0xb) {
            iVar7 = 0xc;
            iVar8 = -0xc;
            do {
              uVar6 = mt_random();
              iVar7 = iVar7 + uVar6 % 6;
              iVar8 = iVar8 + 1;
            } while (iVar8 != 0);
            explode((int)(char)uVar24,(int)(char)uVar16,0xb,iVar7,'\0',5);
          }
          if (local_c1 != '\0') {
            if (beam_type == 1) {
              pcVar11 = "burn away";
            }
            else if (beam_type == 2) {
              pcVar11 = "shatter";
            }
            else {
              pcVar11 = "destroy";
              if (beam_type == 4) {
                pcVar11 = "disintegrate";
              }
            }
            pay_for_damage(pcVar11,'\0');
          }
          bhitpos = local_6a;
          return;
        }
        if ((beam_type == 4) && (ppVar3 == local_38)) {
          if (worm->wormno == '\0') {
            if (((viz_array[worm->my][worm->mx] & 2U) == 0) &&
               ((((u.uprops[0x1e].intrinsic != 0 ||
                  (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                   (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                 ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
                (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
                  (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                 (((viz_array[worm->my][worm->mx] & 1U) == 0 || ((ppVar3->mflags3 & 0x200) == 0)))))
                ))) goto LAB_0029745c;
          }
          else {
            bVar5 = worm_known(level,worm);
            if (bVar5 == '\0') goto LAB_0029745c;
          }
          uVar6 = *(uint *)&worm->field_0x60;
          if ((((uVar6 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar6 & 0x280) != 0) goto LAB_0029745c;
          }
          else if (((uVar6 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
          goto LAB_0029745c;
          if ((u._1052_1_ & 0x20) == 0) {
            hit(local_b0,'\0',worm,".");
            pcVar11 = Monnam(worm);
            pcVar10 = "ray";
            if ((int)local_90 == 0x18) {
              pcVar10 = "bolt";
            }
            pline("%s absorbs the deadly %s!",pcVar11,pcVar10);
            pline("It seems even stronger than before.");
          }
          goto LAB_0029745c;
        }
        iVar29 = (int)local_90;
        if (iVar8 != 1000) {
          if (worm->mhp < 1) {
            if ((int)local_90 < 0) {
              monkilled(worm,local_b0,0xf2);
              uVar17 = local_a0;
              uVar31 = local_98;
            }
            else {
              killed(worm);
              uVar17 = local_a0;
              uVar31 = local_98;
            }
            goto LAB_002964df;
          }
          if (local_78 == (obj *)0x0) {
            pcVar11 = "!";
            if (iVar8 < 5) {
              pcVar11 = ".";
            }
            if (iVar8 < 0) {
              pcVar11 = "?";
            }
            hit(local_b0,'\0',worm,pcVar11);
          }
          else {
            if (worm->wormno == '\0') {
              if (((viz_array[worm->my][worm->mx] & 2U) != 0) ||
                 (((((u.uprops[0x1e].intrinsic == 0 &&
                     ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                    (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                   ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                  (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                    (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                   (((viz_array[worm->my][worm->mx] & 1U) != 0 && ((ppVar3->mflags3 & 0x200) != 0)))
                   ))))) goto LAB_00296b36;
            }
            else {
              bVar5 = worm_known(level,worm);
              if (bVar5 != '\0') {
LAB_00296b36:
                uVar28 = *(uint *)&worm->field_0x60;
                if ((((uVar28 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                   (u.uprops[0xc].extrinsic != 0)) {
                  if ((uVar28 & 0x280) == 0) goto LAB_00296b89;
                }
                else if (((uVar28 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00296b89:
                  if ((u._1052_1_ & 0x20) == 0) {
                    pcVar11 = Monnam(worm);
                    pcVar11 = s_suffix(pcVar11);
                    pcVar10 = distant_name(local_78,xname);
                    pline("%s %s is disintegrated!",pcVar11,pcVar10);
                  }
                }
              }
            }
            m_useup(worm,local_78);
          }
          iVar8 = (int)local_c0;
          uVar17 = local_a0;
          uVar31 = local_98;
          if (((uVar6 >> 0x12 & 1) != 0) && ((worm->field_0x62 & 4) == 0)) {
            slept_monst(worm);
            iVar8 = (int)local_c0;
            uVar17 = local_a0;
            uVar31 = local_98;
          }
          goto LAB_00296c38;
        }
        local_b8 = uVar26;
        poVar9 = mlifesaver(worm);
        iVar8 = (int)local_c0;
        if (worm->wormno == '\0') {
          if (((viz_array[worm->my][worm->mx] & 2U) != 0) ||
             ((((u.uprops[0x1e].intrinsic == 0 &&
                (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
              (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                (((youmonst.data)->mflags3 & 0x100) != 0)) &&
               (((viz_array[worm->my][worm->mx] & 1U) != 0 && ((worm->data->mflags3 & 0x200) != 0)))
               ))))) goto LAB_00296557;
        }
        else {
          bVar5 = worm_known(level,worm);
          if (bVar5 != '\0') {
LAB_00296557:
            uVar6 = *(uint *)&worm->field_0x60;
            if ((((uVar6 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar6 & 0x280) == 0) goto LAB_00296598;
            }
            else if (((uVar6 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00296598:
              if ((u._1052_1_ & 0x20) == 0) {
                if (poVar9 == (obj *)0x0) {
                  Monnam(worm);
                  pline("%s is disintegrated!");
                }
                else {
                  hit(local_b0,'\0',worm,"!");
                }
              }
            }
          }
        }
        poVar4 = worm->minvent;
        while (poVar25 = poVar4, local_78 = poVar25, poVar25 != (obj *)0x0) {
          poVar4 = poVar25->nobj;
          if ((poVar25 == poVar9) ||
             (((objects[poVar25->otyp].oc_oprop != '\x04' &&
               (bVar5 = obj_resists(poVar25,5,0x32), bVar5 == '\0')) &&
              (bVar5 = is_quest_artifact(poVar25), bVar5 == '\0')))) {
            if ((poVar25->owornmask != 0) && (poVar25->otyp == 0xf0)) {
              pbVar1 = (byte *)((long)&worm->misc_worn_check + 2);
              *pbVar1 = *pbVar1 & 0xef;
            }
            update_mon_intrinsics(level,worm,poVar25,'\0','\x01');
            poVar25 = local_78;
            obj_extract_self(local_78);
            obfree(poVar25,(obj *)0x0);
          }
        }
        if (iVar29 < 0) {
          monkilled(worm,(char *)0x0,-0xf2);
          uVar17 = local_a0;
          uVar31 = local_98;
          uVar26 = local_b8;
        }
        else {
          xkilled(worm,2);
          uVar17 = local_a0;
          uVar31 = local_98;
          uVar26 = local_b8;
        }
      }
LAB_00296c38:
      uVar12 = (ulong)(iVar8 - 2);
      uVar20 = local_88;
    }
LAB_00296d9a:
    uVar28 = (uint)uVar12;
    if ((((int)local_68 != 0x18) && (beam_type == 4)) && (*local_60 == '\r')) {
      *local_60 = '\x0e';
      if ((viz_array[uVar20][local_58] & 2U) != 0) {
        pline("The tree withers!");
        newsym((int)local_80,iVar7);
      }
      goto LAB_0029745c;
    }
    if ((*local_60 < '\x11') ||
       ((local_b8 = uVar26, bVar5 = closed_door(level,(int)local_80,iVar7), bVar5 != '\0' &&
        (uVar26 = local_b8, -1 < (int)uVar28)))) {
LAB_00296e10:
      if ((int)local_90 == 0xb) {
        uVar16 = (uint)local_a8;
        uVar24 = (uint)uVar26;
        goto LAB_0029745c;
      }
      uVar28 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar28;
      bVar27 = (char)uVar26 - 1;
      if ((((bVar27 < 0x4f) && (uVar28 != 0)) && ((byte)local_a8 < 0x15)) &&
         ((viz_array[local_a8 & 0xff][uVar26 & 0xff] & 2U) != 0)) {
        pcVar11 = The(local_b0);
        pline("%s bounces!",pcVar11);
      }
      iVar29 = (int)uVar31;
      iVar8 = (int)uVar17;
      if (((iVar29 == 0) || (iVar8 == 0)) ||
         (uVar20 = uVar31, uVar6 = mt_random(),
         (uVar6 * -0x33333333 >> 2 | uVar6 * 0x40000000) < 0xccccccd)) {
        uVar31 = (ulong)(uint)-iVar29;
        uVar17 = (ulong)(uint)-iVar8;
      }
      else {
        uVar21 = CONCAT71((int7)(uVar20 >> 8),1);
        uVar19 = (undefined4)uVar21;
        local_c0 = uVar12;
        iVar18 = 0;
        if (((byte)local_3c < 0x4f) && (iVar18 = 0, (byte)local_a8 < 0x15)) {
          uVar12 = local_a8 & 0xff;
          bVar23 = level->locations[bVar23][uVar12].typ;
          if (0x10 < bVar23) {
            bVar5 = closed_door(level,(int)local_80,(int)(char)(byte)local_a8);
            uVar22 = (undefined7)((ulong)uVar21 >> 8);
            uVar28 = (uint)local_c0;
            if (bVar5 == '\0') {
              uVar19 = (undefined4)CONCAT71(uVar22,1);
              if ((0x18 < bVar23) ||
                 ((iVar18 = 0, ((int)local_80 + iVar29) - 1U < 0x4f &&
                  ('\x10' < level->locations[(uint)((int)local_80 + iVar29)][uVar12].typ)))) {
                uVar19 = 0;
                iVar18 = 1;
              }
            }
            else {
              uVar19 = (undefined4)CONCAT71(uVar22,1);
              iVar18 = 0;
            }
          }
        }
        if ((bVar27 < 0x4f) && (bVar15 < 0x15)) {
          bVar15 = level->locations[uVar26 & 0xff][uVar16 & 0xff].typ;
          if (bVar15 < 0x11) {
            uVar28 = (uint)local_c0;
          }
          else {
            local_a8 = CONCAT44(local_a8._4_4_,uVar19);
            bVar5 = closed_door(level,(int)(char)uVar26,iVar7);
            uVar28 = (uint)local_c0;
            if ((bVar5 == '\0') &&
               ((0x18 < bVar15 ||
                (((uint)(iVar7 + iVar8) < 0x15 &&
                 ('\x10' < level->locations[uVar26 & 0xff][(uint)(iVar7 + iVar8)].typ)))))) {
              if ((char)local_a8 == '\0') {
                uVar6 = mt_random();
                iVar18 = 1;
                if ((uVar6 & 1) == 0) goto LAB_00296fc7;
              }
              iVar18 = 2;
            }
          }
        }
LAB_00296fc7:
        if (iVar18 == 2) {
          uVar31 = (ulong)(uint)-iVar29;
        }
        else {
          if (iVar18 != 1) {
            uVar31 = (ulong)(uint)-iVar29;
          }
          uVar17 = (ulong)(uint)-iVar8;
        }
        iVar7 = zapdir_to_effect((int)uVar31,(int)uVar17,beam_type,(boolean)local_40);
        tmp_at(-5,iVar7);
      }
    }
    uVar12 = (ulong)(uVar28 - 1);
    uVar6 = uVar24;
    if ((int)uVar28 < 1) goto LAB_0029745c;
  } while( true );
}

Assistant:

void buzz(int type, int nd, xchar sx, xchar sy, int dx, int dy)
{
    int range, abstype = abs(type) % 10;
    struct rm *loc;
    xchar lsx, lsy;
    struct monst *mon;
    coord save_bhitpos;
    boolean shopdamage = FALSE;
    const char *fltxt;
    struct obj *otmp;
    int spell_type;
    boolean is_breath = (type >= 20 && type <= 29) ||
			(type >= -29 && type <= -20);
    /* show breath glyphs for non-reflectable breaths (any but disintegration) */
    boolean show_breath_glyph = is_breath && abs(type) != ZT_BREATH(ZT_DEATH);

    /* if its a Hero Spell then get its SPE_TYPE */
    spell_type = is_hero_spell(type) ? SPE_MAGIC_MISSILE + abstype : 0;

    fltxt = flash_types[(type <= -30) ? abstype : abs(type)];
    if (u.uswallow) {
	int tmp;

	if (type < 0) return;
	tmp = zap_hit_mon(u.ustuck, type, nd, &otmp);
	if (!u.ustuck)	u.uswallow = 0;
	else	pline("%s rips into %s%s",
		      The(fltxt), mon_nam(u.ustuck), exclam(tmp));
	/* Using disintegration from the inside only makes a hole... */
	if (tmp == MAGIC_COOKIE)
	    u.ustuck->mhp = 0;
	if (u.ustuck->mhp < 1)
	    killed(u.ustuck);
	return;
    }
    if (type < 0) newsym(u.ux,u.uy);
    range = rn1(7,7);
    if (dx == 0 && dy == 0) range = 1;
    save_bhitpos = bhitpos;

    tmp_at(DISP_BEAM, zapdir_to_effect(dx, dy, abstype, show_breath_glyph));
    while (range-- > 0) {
	lsx = sx; sx += dx;
	lsy = sy; sy += dy;
	if (isok(sx,sy) && (loc = &level->locations[sx][sy])->typ) {
	    mon = m_at(level, sx, sy);
	    if (cansee(sx,sy)) {
		/* reveal/unreveal invisible monsters before tmp_at() */
		if (mon && !canspotmon(level, mon))
		    map_invisible(sx, sy);
		else if (!mon && level->locations[sx][sy].mem_invis) {
		    unmap_object(sx, sy);
		    newsym(sx, sy);
		}
		if (ZAP_POS(loc->typ) || (isok(lsx,lsy) && cansee(lsx,lsy)))
		    tmp_at(sx,sy);
		win_delay_output(); /* wait a little */
	    }
	} else
	    goto make_bounce;

	/* hit() and miss() need bhitpos to match the target */
	bhitpos.x = sx,  bhitpos.y = sy;
	/* Fireballs only damage when they explode */
	if (type != ZT_SPELL(ZT_FIRE))
	    range += zap_over_floor(sx, sy, type, &shopdamage);

	if (mon) {
	    if (type == ZT_SPELL(ZT_FIRE)) break;
	    if (type >= 0) mon->mstrategy &= ~STRAT_WAITMASK;
buzzmonst:
	    if (zap_hit_check(find_mac(mon), spell_type)) {
		/* breaths (except disintegration) are not blocked by reflection */
		if ((!is_breath || abs(type) == ZT_BREATH(ZT_DEATH)) &&
		    mon_reflects(mon, NULL)) {
		    if (cansee(mon->mx,mon->my)) {
			hit(fltxt, FALSE, mon, exclam(0));
			shieldeff(mon->mx, mon->my);
			mon_reflects(mon, "But it reflects from %s %s!");
		    }
		    dx = -dx;
		    dy = -dy;
		} else {
		    boolean mon_could_move = mon->mcanmove;
		    int tmp = zap_hit_mon(mon, type, nd, &otmp);

		    if (is_rider(mon->data) && abs(type) == ZT_BREATH(ZT_DEATH)) {
			if (canseemon(level, mon)) {
			    hit(fltxt, FALSE, mon, ".");
			    pline("%s disintegrates.", Monnam(mon));
			    pline("%s body reintegrates before your %s!",
				  s_suffix(Monnam(mon)),
				  (eyecount(youmonst.data) == 1) ?
				  	body_part(EYE) : makeplural(body_part(EYE)));
			    pline("%s resurrects!", Monnam(mon));
			}
			mon->mhp = mon->mhpmax;
			break; /* Out of while loop */
		    }
		    if (mon->data == &mons[PM_DEATH] && abstype == ZT_DEATH) {
			if (canseemon(level, mon)) {
			    hit(fltxt, FALSE, mon, ".");
			    pline("%s absorbs the deadly %s!", Monnam(mon),
				  type == ZT_BREATH(ZT_DEATH) ?
					"bolt" : "ray");
			    pline("It seems even stronger than before.");
			}
			break; /* Out of while loop */
		    }

		    if (tmp == MAGIC_COOKIE) { /* disintegration */
			struct obj *otmp2, *m_amulet = mlifesaver(mon);

			if (canseemon(level, mon)) {
			    if (!m_amulet)
				pline("%s is disintegrated!", Monnam(mon));
			    else
				hit(fltxt, FALSE, mon, "!");
			}

/* note: worn amulet of life saving must be preserved in order to operate */
#ifndef oresist_disintegration
#define oresist_disintegration(obj) \
		(objects[obj->otyp].oc_oprop == DISINT_RES || \
		 obj_resists(obj, 5, 50) || is_quest_artifact(obj) || \
		 obj == m_amulet)
#endif

			for (otmp = mon->minvent; otmp; otmp = otmp2) {
			    otmp2 = otmp->nobj;
			    if (otmp == m_amulet || !oresist_disintegration(otmp)) {
				/* update the monsters intrinsics and saddle in
				 * case it is lifesaved. */
				if (otmp->owornmask && otmp->otyp == SADDLE)
				    mon->misc_worn_check &= ~W_SADDLE;
				update_mon_intrinsics(level, mon, otmp, FALSE, TRUE);
				obj_extract_self(otmp);
				obfree(otmp, NULL);
			    }
			}

			if (type < 0)
			    monkilled(mon, NULL, -AD_RBRE);
			else
			    xkilled(mon, 2);
		    } else if (mon->mhp < 1) {
			if (type < 0)
			    monkilled(mon, fltxt, AD_RBRE);
			else
			    killed(mon);
		    } else {
			if (!otmp) {
			    /* normal non-fatal hit */
			    hit(fltxt, FALSE, mon, exclam(tmp));
			} else {
			    /* some armor was destroyed; no damage done */
			    if (canseemon(level, mon))
				pline("%s %s is disintegrated!",
				      s_suffix(Monnam(mon)),
				      distant_name(otmp, xname));
			    m_useup(mon, otmp);
			}
			if (mon_could_move && !mon->mcanmove)	/* ZT_SLEEP */
			    slept_monst(mon);
		    }
		}
		range -= 2;
	    } else {
		miss(fltxt,mon);
	    }
	} else if (sx == u.ux && sy == u.uy && range >= 0) {
	    nomul(0, NULL);
	    /* breaths (except disintegration) are not blocked by reflection */
	    if (u.usteed && !rn2(3) &&
		!((!is_breath || abs(type) == ZT_BREATH(ZT_DEATH)) &&
		  mon_reflects(u.usteed, NULL))) {
		    mon = u.usteed;
		    goto buzzmonst;
	    } else if (zap_hit_check((int) u.uac, 0)) {
		range -= 2;
		pline("%s hits you!", The(fltxt));
		/* breaths (except disintegration) are not blocked by reflection */
		if ((!is_breath || abs(type) == ZT_BREATH(ZT_DEATH)) && Reflecting) {
		    if (!Blind) {
		    	ureflects("But %s reflects from your %s!", "it");
		    } else
			pline("For some reason you are not affected.");
		    dx = -dx;
		    dy = -dy;
		    shieldeff(sx, sy);
		} else {
		    zap_hit_u(type, nd, fltxt, sx, sy);
		}
	    } else {
		pline("%s whizzes by you!", The(fltxt));
	    }
	    if (abstype == ZT_LIGHTNING && !resists_blnd(&youmonst)) {
		pline(blinded_by_the_flash);
		make_blinded((long)dice(nd,50),FALSE);
		if (!Blind) pline("Your vision quickly clears.");
	    }
	    stop_occupation();
	    nomul(0, NULL);
	}

	if (loc->typ == TREE && abstype == ZT_DEATH &&
	    abs(type) != ZT_BREATH(ZT_DEATH)) {
	    loc->typ = DEADTREE;
	    if (cansee(sx, sy)) {
		pline("The tree withers!");
		newsym(sx, sy);
	    }
	    range = 0;
	    break;
	}

	if (!ZAP_POS(loc->typ) || (closed_door(level, sx, sy) && (range >= 0))) {
	    int bounce;
	    uchar rmn;

 make_bounce:
	    if (type == ZT_SPELL(ZT_FIRE)) {
		sx = lsx;
		sy = lsy;
		break; /* fireballs explode before the wall */
	    }
	    bounce = 0;
	    range--;
	    if (range && isok(lsx, lsy) && cansee(lsx,lsy))
		pline("%s bounces!", The(fltxt));
	    if (!dx || !dy || !rn2(20)) {
		dx = -dx;
		dy = -dy;
	    } else {
		if (isok(sx,lsy) && ZAP_POS(rmn = level->locations[sx][lsy].typ) &&
		   !closed_door(level, sx,lsy) &&
		   (IS_ROOM(rmn) || (isok(sx+dx,lsy) &&
				     ZAP_POS(level->locations[sx+dx][lsy].typ))))
		    bounce = 1;
		if (isok(lsx,sy) && ZAP_POS(rmn = level->locations[lsx][sy].typ) &&
		   !closed_door(level, lsx,sy) &&
		   (IS_ROOM(rmn) || (isok(lsx,sy+dy) &&
				     ZAP_POS(level->locations[lsx][sy+dy].typ))))
		    if (!bounce || rn2(2))
			bounce = 2;

		switch(bounce) {
		case 0: dx = -dx; /* fall into... */
		case 1: dy = -dy; break;
		case 2: dx = -dx; break;
		}
		tmp_at(DISP_CHANGE, zapdir_to_effect(dx, dy, abstype,
						     show_breath_glyph));
	    }
	}
    }
    tmp_at(DISP_END,0);
    if (type == ZT_SPELL(ZT_FIRE))
	explode(sx, sy, type, dice(12,6), 0, EXPL_FIERY);
    if (shopdamage)
	pay_for_damage(abstype == ZT_FIRE ?  "burn away" :
		       abstype == ZT_COLD ?  "shatter" :
		       abstype == ZT_DEATH ? "disintegrate" : "destroy", FALSE);
    bhitpos = save_bhitpos;
}